

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

void duckdb::CreateUpdateChunk
               (ExecutionContext *context,DataChunk *chunk,TableCatalogEntry *table,Vector *row_ids,
               DataChunk *update_chunk,PhysicalInsert *op)

{
  SelectionVector *this;
  pointer *types;
  ClientContext *pCVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  type expression;
  reference pvVar4;
  pointer pLVar5;
  idx_t iVar6;
  initializer_list<duckdb::LogicalType> __l;
  ExpressionExecutor executor;
  ExpressionExecutor where_executor;
  DataChunk do_update_filter_result;
  allocator_type local_119;
  undefined1 local_118 [32];
  optional_ptr<duckdb::ClientContext,_true> oStack_f8;
  undefined1 local_f0 [16];
  SelectionVector local_e0;
  TableCatalogEntry *local_c8;
  ExecutionContext *local_c0;
  ExpressionExecutor local_b8;
  DataChunk local_70;
  
  if (update_chunk[4].vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    local_c8 = table;
    DataChunk::DataChunk(&local_70);
    pCVar1 = context->client;
    LogicalType::LogicalType((LogicalType *)&local_b8,BOOLEAN);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_b8;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_118,__l,
               &local_119);
    DataChunk::Initialize(&local_70,pCVar1,(vector<duckdb::LogicalType,_true> *)local_118,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_118);
    LogicalType::~LogicalType((LogicalType *)&local_b8);
    pCVar1 = context->client;
    local_c0 = context;
    expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&update_chunk[4].vector_caches);
    ExpressionExecutor::ExpressionExecutor(&local_b8,pCVar1,expression);
    ExpressionExecutor::Execute(&local_b8,chunk,&local_70);
    local_70.count = chunk->count;
    DataChunk::Flatten(&local_70);
    pLVar5 = (pointer)chunk->count;
    local_118[0] = 1;
    local_118._24_8_ = (DataChunk *)0x0;
    oStack_f8.ptr = (ClientContext *)0x0;
    local_f0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._16_8_ = pLVar5;
    OptionalSelection::OptionalSelection((OptionalSelection *)(local_f0 + 8),(SelectionVector *)0x0)
    ;
    this = (SelectionVector *)(local_118 + 0x18);
    local_118._8_8_ = (pointer)0x0;
    if (local_118[0] != '\0') {
      SelectionVector::Initialize(this,(idx_t)pLVar5);
      this_00._M_pi =
           local_e0.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_e0.sel_vector = (sel_t *)local_118._24_8_;
      local_e0.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_e0.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_f0._8_8_ = this;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      local_f0._8_8_ = &local_e0;
    }
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&local_70.data,0);
    iVar2 = chunk->count;
    if (iVar2 != 0) {
      pdVar3 = pvVar4->data;
      iVar6 = 0;
      pLVar5 = (pointer)local_118._8_8_;
      do {
        if (pdVar3[iVar6] == '\x01') {
          if ((SelectionVector *)local_f0._8_8_ != (SelectionVector *)0x0) {
            (*(sel_t **)local_f0._8_8_)[(long)pLVar5] = (sel_t)iVar6;
          }
          pLVar5 = (pointer)&pLVar5->physical_type_;
          local_118._8_8_ = pLVar5;
        }
        iVar6 = iVar6 + 1;
      } while (iVar2 != iVar6);
    }
    if (local_118._8_8_ != local_118._16_8_) {
      DataChunk::Slice(chunk,this,local_118._8_8_);
      chunk->count = local_118._8_8_;
      Vector::Slice((Vector *)local_c8,this,local_118._8_8_);
      Vector::Flatten((Vector *)local_c8,local_118._8_8_);
    }
    if (local_e0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._0_8_);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
    ::~vector(&local_b8.states.
               super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
             );
    if ((void *)CONCAT71(local_b8.expressions.
                         super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                         .
                         super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_b8.expressions.
                         super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                         .
                         super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_b8.expressions.
                                       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                       .
                                       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_b8.expressions.
                                       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                       .
                                       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    DataChunk::~DataChunk(&local_70);
    context = local_c0;
  }
  types = &update_chunk[4].data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (chunk->count == 0) {
    local_b8.expressions.
    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_118,
               ((long)update_chunk[4].data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
                (long)update_chunk[4].data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish >> 3) * -0x5555555555555555,
               (bool *)&local_b8,(allocator_type *)&local_70);
    DataChunk::Initialize
              ((DataChunk *)row_ids,context->client,(vector<duckdb::LogicalType,_true> *)types,
               (vector<bool,_true> *)local_118,chunk->count);
    (row_ids->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chunk->count;
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  else {
    DataChunk::Initialize
              ((DataChunk *)row_ids,context->client,(vector<duckdb::LogicalType,_true> *)types,
               chunk->count);
    ExpressionExecutor::ExpressionExecutor
              ((ExpressionExecutor *)local_118,context->client,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&update_chunk[3].count);
    ExpressionExecutor::Execute((ExpressionExecutor *)local_118,chunk,(DataChunk *)row_ids);
    (row_ids->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chunk->count;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
               *)local_f0);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  return;
}

Assistant:

static void CreateUpdateChunk(ExecutionContext &context, DataChunk &chunk, TableCatalogEntry &table, Vector &row_ids,
                              DataChunk &update_chunk, const PhysicalInsert &op) {

	auto &do_update_condition = op.do_update_condition;
	auto &set_types = op.set_types;
	auto &set_expressions = op.set_expressions;

	// Check the optional condition for the DO UPDATE clause, to filter which rows will be updated
	if (do_update_condition) {
		DataChunk do_update_filter_result;
		do_update_filter_result.Initialize(context.client, {LogicalType::BOOLEAN});
		ExpressionExecutor where_executor(context.client, *do_update_condition);
		where_executor.Execute(chunk, do_update_filter_result);
		do_update_filter_result.SetCardinality(chunk.size());
		do_update_filter_result.Flatten();

		ManagedSelection selection(chunk.size());

		auto where_data = FlatVector::GetData<bool>(do_update_filter_result.data[0]);
		for (idx_t i = 0; i < chunk.size(); i++) {
			if (where_data[i]) {
				selection.Append(i);
			}
		}
		if (selection.Count() != selection.Size()) {
			// Not all conflicts met the condition, need to filter out the ones that don't
			chunk.Slice(selection.Selection(), selection.Count());
			chunk.SetCardinality(selection.Count());
			// Also apply this Slice to the to-update row_ids
			row_ids.Slice(selection.Selection(), selection.Count());
			row_ids.Flatten(selection.Count());
		}
	}

	if (chunk.size() == 0) {
		auto initialize = vector<bool>(set_types.size(), false);
		update_chunk.Initialize(context.client, set_types, initialize, chunk.size());
		update_chunk.SetCardinality(chunk);
		return;
	}

	// Execute the SET expressions.
	update_chunk.Initialize(context.client, set_types, chunk.size());
	ExpressionExecutor executor(context.client, set_expressions);
	executor.Execute(chunk, update_chunk);
	update_chunk.SetCardinality(chunk);
}